

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_ptr_array.c
# Opt level: O2

int zt_ptr_array_cat(zt_ptr_array *dst,zt_ptr_array *src)

{
  int iVar1;
  void *data;
  int idx;
  
  if (src != (zt_ptr_array *)0x0 && dst != (zt_ptr_array *)0x0) {
    idx = 0;
    do {
      if (src->count <= idx) {
        return 0;
      }
      data = zt_ptr_array_get_idx(src,idx);
      iVar1 = zt_ptr_array_add(dst,data);
      idx = idx + 1;
    } while (iVar1 == 0);
  }
  return -1;
}

Assistant:

int
zt_ptr_array_cat(zt_ptr_array * dst, zt_ptr_array * src) {
    int32_t i;

    if (dst == NULL || src == NULL) {
        return -1;
    }

    for (i = 0; i < src->count; i++) {
        if (zt_ptr_array_add(dst, zt_ptr_array_get_idx(src, i))) {
            return -1;
        }
    }

    return 0;
}